

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Polynom<Rational> __thiscall
Polynom<Rational>::operator*(Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  uint uVar2;
  crow_t a_00;
  Rational *this_00;
  Matrix<Rational> *in_RDX;
  Rational *extraout_RDX;
  Matrix<Rational> *in_RSI;
  Rational *in_RDI;
  Polynom<Rational> PVar3;
  Rational *unaff_retaddr;
  uint j;
  uint i;
  Polynom<Rational> *temp;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  Polynom<Rational> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff20;
  crow_t in_stack_ffffffffffffff40;
  MatrixRow<Rational_&> local_88;
  MatrixRow<const_Rational_&> local_80;
  MatrixRow<const_Rational_&> local_78 [9];
  uint local_30;
  uint local_20;
  undefined1 local_19;
  Matrix<Rational> *local_18;
  Rational *a_01;
  
  local_19 = 0;
  local_18 = in_RDX;
  a_01 = in_RDI;
  Matrix<Rational>::width(in_RSI);
  Matrix<Rational>::width(local_18);
  Polynom(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  for (local_20 = 0; uVar2 = local_20, uVar1 = Matrix<Rational>::width(in_RSI), uVar2 < uVar1;
      local_20 = local_20 + 1) {
    for (local_30 = 0; uVar2 = local_30, uVar1 = Matrix<Rational>::width(local_18), uVar2 < uVar1;
        local_30 = local_30 + 1) {
      in_stack_ffffffffffffff40 =
           Matrix<Rational>::operator[]
                     ((Matrix<Rational> *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
      local_78[0].arr = in_stack_ffffffffffffff40.arr;
      uVar2 = Matrix<Rational>::width(in_RSI);
      Matrix<Rational>::MatrixRow<const_Rational_&>::operator[](local_78,~local_20 + uVar2);
      a_00 = Matrix<Rational>::operator[]
                       ((Matrix<Rational> *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
      local_80.arr = a_00.arr;
      uVar2 = Matrix<Rational>::width(local_18);
      Matrix<Rational>::MatrixRow<const_Rational_&>::operator[](&local_80,~local_30 + uVar2);
      ::operator*(a_00.arr,(Rational *)CONCAT44(uVar2,in_stack_ffffffffffffff20));
      local_88.arr = (Rational *)
                     Matrix<Rational>::operator[]
                               ((Matrix<Rational> *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
      uVar2 = Matrix<Rational>::width((Matrix<Rational> *)in_RDI);
      this_00 = Matrix<Rational>::MatrixRow<Rational_&>::operator[]
                          (&local_88,(~local_20 + uVar2) - local_30);
      Rational::operator+=(unaff_retaddr,a_01);
      Rational::~Rational(this_00);
    }
  }
  strip((Polynom<Rational> *)in_stack_ffffffffffffff40.arr);
  PVar3.m.arr = extraout_RDX;
  PVar3.m._0_8_ = in_RDI;
  return (Polynom<Rational>)PVar3.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}